

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O0

void __thiscall Symbol_table::set_value(Symbol_table *this,string *s,double d)

{
  bool bVar1;
  __type _Var2;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  reference local_40;
  Variable *var;
  iterator __end1;
  iterator __begin1;
  Vector<Variable> *__range1;
  double d_local;
  string *s_local;
  Symbol_table *this_local;
  
  __end1 = std::vector<Variable,_std::allocator<Variable>_>::begin
                     ((vector<Variable,_std::allocator<Variable>_> *)this);
  var = (Variable *)
        std::vector<Variable,_std::allocator<Variable>_>::end
                  ((vector<Variable,_std::allocator<Variable>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Variable_*,_std::vector<Variable,_std::allocator<Variable>_>_>
                                *)&var);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"set: undefined name ",&local_99);
      error(&local_98,s);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      return;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<Variable_*,_std::vector<Variable,_std::allocator<Variable>_>_>::
               operator*(&__end1);
    _Var2 = std::operator==(&local_40->name,s);
    if (_Var2) break;
    __gnu_cxx::__normal_iterator<Variable_*,_std::vector<Variable,_std::allocator<Variable>_>_>::
    operator++(&__end1);
  }
  if ((local_40->is_const & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"value of constant cannot be changed",&local_61);
    error(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  local_40->value = d;
  return;
}

Assistant:

void Symbol_table::set_value(const string& s, double d)
{
	for (auto&& var : var_table)
		if (var.name == s)
		{
			if (var.is_const)
				error("value of constant cannot be changed");
			var.value = d;
			return;
		}
	error("set: undefined name ", s);
}